

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSpaceType::~IfcSpaceType(IfcSpaceType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x58 = 0x847f68;
  *(undefined8 *)&this->field_0x40 = 0x848080;
  *(undefined8 *)&this[-1].field_0xe0 = 0x847f90;
  *(undefined8 *)&this[-1].field_0xf0 = 0x847fb8;
  *(undefined8 *)&this[-1].field_0x148 = 0x847fe0;
  *(undefined8 *)&this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>.field_0x10
       = 0x848008;
  *(undefined8 *)this = 0x848030;
  *(undefined8 *)&this->field_0x10 = 0x848058;
  if (*(undefined1 **)&this->field_0x20 != &this->field_0x30) {
    operator_delete(*(undefined1 **)&this->field_0x20);
  }
  *(undefined8 *)&this[-1].field_0x58 = 0x848348;
  *(undefined8 *)&this->field_0x40 = 0x848410;
  *(undefined8 *)&this[-1].field_0xe0 = 0x848370;
  *(undefined8 *)&this[-1].field_0xf0 = 0x848398;
  *(undefined8 *)&this[-1].field_0x148 = 0x8483c0;
  *(undefined8 *)&this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>.field_0x10
       = 0x8483e8;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>.field_0x20;
  if (puVar1 != &this[-1].field_0x1c0) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x58,&PTR_construction_vtable_24__008480a8);
  operator_delete(&this[-1].field_0x58);
  return;
}

Assistant:

IfcSpaceType() : Object("IfcSpaceType") {}